

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O3

void __thiscall
BasicLoggerTimeFixture_ArbitraryPointInTime_Test::~BasicLoggerTimeFixture_ArbitraryPointInTime_Test
          (BasicLoggerTimeFixture_ArbitraryPointInTime_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (BasicLoggerTimeFixture, ArbitraryPointInTime) {
    time_zone_setter tzs ("UTC0");
    std::time_t const time{1447134860};
    std::size_t const r =
        pstore::basic_logger::time_string (time, pstore::gsl::make_span (buffer_));
    EXPECT_EQ (std::size_t{24}, r);
    this->canonicalize_sign ();
    EXPECT_STREQ ("2015-11-10T05:54:20-0000", buffer_.data ());
}